

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

xmlC14NVisibleNsStackPtr xmlC14NVisibleNsStackCreate(void)

{
  xmlC14NVisibleNsStackPtr ret;
  
  ret = (xmlC14NVisibleNsStackPtr)(*xmlMalloc)(0x20);
  if (ret == (xmlC14NVisibleNsStackPtr)0x0) {
    ret = (xmlC14NVisibleNsStackPtr)0x0;
  }
  else {
    memset(ret,0,0x20);
  }
  return ret;
}

Assistant:

static xmlC14NVisibleNsStackPtr
xmlC14NVisibleNsStackCreate(void) {
    xmlC14NVisibleNsStackPtr ret;

    ret = (xmlC14NVisibleNsStackPtr) xmlMalloc(sizeof(xmlC14NVisibleNsStack));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlC14NVisibleNsStack));
    return(ret);
}